

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_log.cpp
# Opt level: O2

int anon_unknown.dwarf_57e3e::trace_indent_line(TraceState *state)

{
  uint uVar1;
  int iVar2;
  _Elt_pointer piVar3;
  size_t sVar4;
  char *__assertion;
  
  piVar3 = (state->current_depths).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (state->current_depths).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    __assertion = "!state.current_depths.empty()";
    uVar1 = 0x34;
LAB_0013b340:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/trace_log.cpp"
                  ,uVar1,"int (anonymous namespace)::trace_indent_line(TraceState &)");
  }
  if (piVar3 == (state->current_depths).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (state->current_depths).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  uVar1 = piVar3[-1];
  if ((int)uVar1 < 1) {
    iVar2 = 0;
  }
  else {
    if (0x4f < uVar1) {
      __assertion = "width >=0 && width< 160";
      uVar1 = 0x39;
      goto LAB_0013b340;
    }
    sVar4 = fwrite("                                                                                                                                                                                                                                                      "
                   ,1,(ulong)(uVar1 * 2),(FILE *)state->report);
    iVar2 = (int)sVar4;
  }
  return iVar2;
}

Assistant:

int trace_indent_line(TraceState &state) {
	static const char spaces[]="                                                                                                                                                                                                                                                      ";

	assert(!state.current_depths.empty());
	int width = state.current_depths.top() * 2;

	if (width <= 0) return 0;

	assert(width >=0 && width< 160);
	return (int)fwrite(spaces, 1, width, state.report);
}